

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMeshDecimator.cpp
# Opt level: O1

long __thiscall HACD::MeshDecimator::IsBoundaryEdge(MeshDecimator *this,long v1,long v2)

{
  SArray<long,_16UL> *pSVar1;
  pointer pMVar2;
  size_t sVar3;
  long lVar4;
  SArray<long,_16UL> *pSVar5;
  size_t sVar6;
  SArray<long,_16UL> *pSVar7;
  size_t sVar8;
  bool bVar9;
  
  pMVar2 = (this->m_vertices).super__Vector_base<HACD::MDVertex,_std::allocator<HACD::MDVertex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar3 = pMVar2[v1].m_triangles.m_size;
  if (sVar3 == 0) {
    return -1;
  }
  pSVar5 = &pMVar2[v1].m_triangles;
  if (pSVar5->m_maxSize != 0x10) {
    pSVar5 = (SArray<long,_16UL> *)pSVar5->m_data;
  }
  pSVar1 = &pMVar2[v2].m_triangles;
  lVar4 = -1;
  sVar6 = 0;
  do {
    if (pSVar1->m_size != 0) {
      pSVar7 = pSVar1;
      if (pSVar1->m_maxSize != 0x10) {
        pSVar7 = (SArray<long,_16UL> *)pSVar1->m_data;
      }
      sVar8 = 0;
      do {
        if ((pSVar5->m_data0[sVar6] == pSVar7->m_data0[sVar8]) &&
           (bVar9 = lVar4 != -1, lVar4 = pSVar5->m_data0[sVar6], bVar9)) {
          return -1;
        }
        sVar8 = sVar8 + 1;
      } while (pSVar1->m_size != sVar8);
    }
    sVar6 = sVar6 + 1;
    if (sVar6 == sVar3) {
      return lVar4;
    }
  } while( true );
}

Assistant:

long MeshDecimator::IsBoundaryEdge(long v1, long v2) const
	{
		long commonTri = -1;
		long itTriangle1, itTriangle2;
		for(size_t itT1 = 0; itT1 < m_vertices[v1].m_triangles.Size(); ++itT1)
		{
            itTriangle1 = m_vertices[v1].m_triangles[itT1];
			for(size_t itT2 = 0; itT2 < m_vertices[v2].m_triangles.Size(); ++itT2)
			{
                itTriangle2 = m_vertices[v2].m_triangles[itT2];
				if (itTriangle1 == itTriangle2)
				{
					if (commonTri == -1)
					{
						commonTri = itTriangle1;
					}
					else
					{
						return -1;
					}
				}
			}
		}
		return commonTri;
	}